

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O2

int __thiscall
SudokuChain::getFieldIndex
          (SudokuChain *this,int x,int y,shared_ptr<SudokuChain::SudokuSpecification> *specification
          )

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  __shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar1 = (specification->
           super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->previous).
      super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar2 = x + peVar1->firstOwnIndex + y * peVar1->squared_size;
  }
  else if ((((x < peVar1->xa) || (peVar1->xb <= x)) || (y < peVar1->ya)) || (peVar1->yb <= y)) {
    iVar2 = peVar1->firstOwnIndex;
    iVar4 = 0;
    iVar3 = 0;
    if (0 < y) {
      iVar4 = y;
      iVar3 = 0;
    }
    for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      if (iVar3 < peVar1->ya) {
        iVar5 = peVar1->squared_size;
      }
      else {
        iVar5 = peVar1->squared_size;
        if (iVar3 < peVar1->yb) {
          iVar5 = (iVar5 + peVar1->xa) - peVar1->xb;
        }
      }
      iVar2 = iVar2 + iVar5;
    }
    if ((peVar1->ya <= y) && (y < peVar1->yb)) {
      iVar4 = 0;
      if (peVar1->xb <= x) {
        iVar4 = peVar1->xb;
      }
      x = x - iVar4;
    }
    iVar2 = x + iVar2;
  }
  else {
    iVar2 = peVar1->offset_from_previous_x;
    iVar4 = peVar1->offset_from_previous_y;
    std::__shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &(peVar1->previous).
                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = getFieldIndex(this,x + iVar2,y + iVar4,
                          (shared_ptr<SudokuChain::SudokuSpecification> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return iVar2;
}

Assistant:

int SudokuChain::getFieldIndex(int x, int y, std::shared_ptr<SudokuSpecification> specification)
{
  bool debug = false;

  if(specification->previous == nullptr)
  {
    if(debug)
      std::cout<<"    (no previous)"<<std::endl;
    return specification->firstOwnIndex + y*specification->squared_size + x;
  }

  // compute coordinates of with previous overlapping area in current sudoku
  int &xa = specification->xa;
  int &ya = specification->ya;
  int &xb = specification->xb;
  int &yb = specification->yb;

  // check if position is inside with previous overlapping area in current sudoku
  if(x >= xa && x < xb && y >= ya && y < yb)
  {
    if(debug)
      std::cout<<"    (ask previous at (x,y)=("<<x+specification->offset_from_previous_x<<", "<<y+specification->offset_from_previous_y<<")"<<std::endl;
    return getFieldIndex(x+specification->offset_from_previous_x, y+specification->offset_from_previous_y, specification->previous);
  }
  else
  {
    int index = specification->firstOwnIndex;

    // number of elements in rows before current row (y)
    for(int y_index = 0; y_index < y; y_index++)
    {
      if(ya <= y_index && y_index < yb)
      {
        index += specification->squared_size - (xb-xa);
      }
      else
      {
        index += specification->squared_size;
      }
    }
    if(ya <= y && y < yb)
    {
      if(xb <= x)
      {
        index += x-xb;
      }
      else
      {
        index += x;
      }
    }
    else
    {
      index += x;
    }
    return index;
  }
}